

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_env_mod.cxx
# Opt level: O0

void __thiscall xray_re::xr_level_env_mod::save(xr_level_env_mod *this,xr_writer *w)

{
  env_mod_data *v;
  bool bVar1;
  reference ppeVar2;
  env_mod_data *em;
  env_mod_data_vec_cit end;
  env_mod_data_vec_cit it;
  uint32_t id;
  xr_writer *w_local;
  xr_level_env_mod *this_local;
  
  it._M_current._4_1_ = this->m_version != 0;
  if (it._M_current._4_1_) {
    xr_writer::w_chunk<unsigned_int>(w,0,&this->m_version);
  }
  it._M_current._5_3_ = 0;
  end._M_current =
       (env_mod_data **)
       std::vector<xray_re::env_mod_data_*,_std::allocator<xray_re::env_mod_data_*>_>::begin
                 (&this->m_env_mods);
  em = (env_mod_data *)
       std::vector<xray_re::env_mod_data_*,_std::allocator<xray_re::env_mod_data_*>_>::end
                 (&this->m_env_mods);
  while (bVar1 = __gnu_cxx::operator!=
                           (&end,(__normal_iterator<xray_re::env_mod_data_*const_*,_std::vector<xray_re::env_mod_data_*,_std::allocator<xray_re::env_mod_data_*>_>_>
                                  *)&em), bVar1) {
    ppeVar2 = __gnu_cxx::
              __normal_iterator<xray_re::env_mod_data_*const_*,_std::vector<xray_re::env_mod_data_*,_std::allocator<xray_re::env_mod_data_*>_>_>
              ::operator*(&end);
    v = *ppeVar2;
    xr_writer::open_chunk(w,it._M_current._4_4_);
    xr_writer::w_fvector3(w,&v->position);
    xr_writer::w_float(w,v->radius);
    xr_writer::w_float(w,v->power);
    xr_writer::w_float(w,v->far_plane);
    xr_writer::w_fvector3(w,&v->fog_color);
    xr_writer::w_float(w,v->fog_density);
    xr_writer::w_fvector3(w,&v->ambient_color);
    xr_writer::w_fvector3(w,&v->sky_color);
    xr_writer::w_fvector3(w,&v->hemi_color);
    if (this->m_version != 0) {
      xr_writer::w_u16(w,v->extra);
    }
    xr_writer::close_chunk(w);
    __gnu_cxx::
    __normal_iterator<xray_re::env_mod_data_*const_*,_std::vector<xray_re::env_mod_data_*,_std::allocator<xray_re::env_mod_data_*>_>_>
    ::operator++(&end);
    it._M_current._4_4_ = it._M_current._4_4_ + 1;
  }
  return;
}

Assistant:

void xr_level_env_mod::save(xr_writer& w) const
{
	uint32_t id;
	if (m_version == ENV_MOD_VERSION_0) {
		id = 0;
	} else {
		id = 1;
		w.w_chunk(ENV_MOD_CHUNK_VERSION, m_version);
	}
	for (env_mod_data_vec_cit it = m_env_mods.begin(), end = m_env_mods.end();
			it != end; ++it, ++id) {
		const env_mod_data* em = *it;
		w.open_chunk(id);
		w.w_fvector3(em->position);
		w.w_float(em->radius);
		w.w_float(em->power);
		w.w_float(em->far_plane);
		w.w_fvector3(em->fog_color);
		w.w_float(em->fog_density);
		w.w_fvector3(em->ambient_color);
		w.w_fvector3(em->sky_color);
		w.w_fvector3(em->hemi_color);
		if (m_version != ENV_MOD_VERSION_0)
			w.w_u16(em->extra);
		w.close_chunk();
	}
}